

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

u32 mode3_tick_count(Emulator *e)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  u32 uVar5;
  uint uVar6;
  long lVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  int local_78 [6];
  s32 buckets [22];
  
  buckets[10] = 0;
  buckets[0xb] = 0;
  buckets[0xc] = 0;
  buckets[0xd] = 0;
  buckets[6] = 0;
  buckets[7] = 0;
  buckets[8] = 0;
  buckets[9] = 0;
  buckets[2] = 0;
  buckets[3] = 0;
  buckets[4] = 0;
  buckets[5] = 0;
  local_78[4] = 0;
  local_78[5] = 0;
  buckets[0] = 0;
  buckets[1] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  buckets[0xe] = 0;
  buckets[0xf] = 0;
  uVar6 = (e->state).ppu.scx & 7;
  uVar5 = uVar6 + 0xac;
  bVar1 = (e->state).ppu.line_obj_count;
  if (bVar1 != 0) {
    lVar7 = 0;
    bVar3 = false;
    do {
      bVar8 = (&(e->state).ppu.line_obj[0].x)[lVar7] + 8;
      if (bVar8 < 0xa8) {
        bVar4 = bVar3;
        if (!bVar3 && bVar8 == 0) {
          bVar4 = true;
        }
        uVar9 = 0;
        if (!bVar3 && bVar8 == 0) {
          uVar9 = uVar6;
        }
        bVar8 = bVar8 + (char)uVar6;
        bVar2 = bVar8 >> 3;
        iVar10 = 5 - (bVar8 & 7);
        if (iVar10 < local_78[bVar2]) {
          iVar10 = local_78[bVar2];
        }
        local_78[bVar2] = iVar10;
        uVar5 = uVar5 + uVar9 + 6;
        bVar3 = bVar4;
      }
      lVar7 = lVar7 + 0x14;
    } while ((ulong)bVar1 * 0x14 != lVar7);
  }
  lVar7 = 0;
  do {
    uVar5 = uVar5 + local_78[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x16);
  return uVar5;
}

Assistant:

static u32 mode3_tick_count(Emulator* e) {
  s32 buckets[SCREEN_WIDTH / 8 + 2];
  ZERO_MEMORY(buckets);
  u8 scx_fine = PPU.scx & 7;
  u32 ticks = PPU_MODE3_MIN_TICKS + scx_fine;
  Bool has_zero = FALSE;
  int i;
  for (i = 0; i < PPU.line_obj_count; ++i) {
    Obj* o = &PPU.line_obj[i];
    u8 x = o->x + OBJ_X_OFFSET;
    if (x >= SCREEN_WIDTH + OBJ_X_OFFSET) {
      continue;
    }
    if (!has_zero && x == 0) {
      has_zero = TRUE;
      ticks += scx_fine;
    }
    x += scx_fine;
    int bucket = x >> 3;
    buckets[bucket] = MAX(buckets[bucket], 5 - (x & 7));
    ticks += 6;
  }
  for (i = 0; i < (int)ARRAY_SIZE(buckets); ++i) {
    ticks += buckets[i];
  }
  return ticks;
}